

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Split_inl.hpp
# Opt level: O0

bool CLI::detail::split_windows_style(string *current,string *name,string *value)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  long local_30;
  size_type loc;
  string *value_local;
  string *name_local;
  string *current_local;
  
  loc = (size_type)value;
  value_local = name;
  name_local = current;
  uVar2 = ::std::__cxx11::string::size();
  if ((1 < uVar2) &&
     (pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)name_local), *pcVar3 == '/')) {
    pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)name_local);
    bVar1 = valid_first_char<char>(*pcVar3);
    if (bVar1) {
      local_30 = ::std::__cxx11::string::find_first_of((char)name_local,0x3a);
      if (local_30 == -1) {
        ::std::__cxx11::string::substr((ulong)local_90,(ulong)name_local);
        ::std::__cxx11::string::operator=((string *)value_local,local_90);
        ::std::__cxx11::string::~string(local_90);
        ::std::__cxx11::string::operator=((string *)loc,"");
      }
      else {
        ::std::__cxx11::string::substr((ulong)local_50,(ulong)name_local);
        ::std::__cxx11::string::operator=((string *)value_local,local_50);
        ::std::__cxx11::string::~string(local_50);
        ::std::__cxx11::string::substr((ulong)local_70,(ulong)name_local);
        ::std::__cxx11::string::operator=((string *)loc,local_70);
        ::std::__cxx11::string::~string(local_70);
      }
      return true;
    }
  }
  return false;
}

Assistant:

CLI11_INLINE bool split_windows_style(const std::string &current, std::string &name, std::string &value) {
    if(current.size() > 1 && current[0] == '/' && valid_first_char(current[1])) {
        auto loc = current.find_first_of(':');
        if(loc != std::string::npos) {
            name = current.substr(1, loc - 1);
            value = current.substr(loc + 1);
        } else {
            name = current.substr(1);
            value = "";
        }
        return true;
    }
    return false;
}